

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O2

void __thiscall
BasicLoggerTimeFixture_EpochInJST_Test::BasicLoggerTimeFixture_EpochInJST_Test
          (BasicLoggerTimeFixture_EpochInJST_Test *this)

{
  anon_unknown.dwarf_30ceb::BasicLoggerTimeFixture::BasicLoggerTimeFixture
            (&this->super_BasicLoggerTimeFixture);
  (this->super_BasicLoggerTimeFixture).super_Test._vptr_Test = (_func_int **)&PTR__Test_00253378;
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, EpochInJST) {
    time_zone_setter tzs ("JST-9"); // Japan
    std::size_t const r =
        pstore::basic_logger::time_string (std::time_t{0}, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    EXPECT_EQ ('\0', buffer_[24]);
    EXPECT_STREQ ("1970-01-01T09:00:00+0900", buffer_.data ());
}